

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2sc_buffer.c
# Opt level: O3

p2sc_buffer_t * p2sc_buffer_new(guint8 *ptr,size_t len)

{
  p2sc_buffer_t *ppVar1;
  size_t sVar2;
  bool bVar3;
  
  ppVar1 = (p2sc_buffer_t *)g_malloc(0x28);
  ppVar1->pos = 0;
  bVar3 = ptr == (guint8 *)0x0;
  sVar2 = len;
  if (bVar3) {
    sVar2 = 0xffff;
    ptr = (guint8 *)g_malloc(0xffff);
    len = 0;
  }
  ppVar1->ptr = ptr;
  ppVar1->allen = sVar2;
  ppVar1->len = len;
  ppVar1->own = (uint)bVar3;
  return ppVar1;
}

Assistant:

p2sc_buffer_t *p2sc_buffer_new(guint8 *ptr, size_t len) {
    p2sc_buffer_t *buf = (p2sc_buffer_t *) g_malloc(sizeof *buf);

    buf->pos = 0;

    if (ptr) {
        buf->ptr = ptr;
        buf->allen = len;
        buf->len = len;
        buf->own = FALSE;
    } else {
        buf->ptr = (guint8 *) g_malloc(SIZBUF);
        buf->allen = SIZBUF;
        buf->len = 0;
        buf->own = TRUE;
    }

    return buf;
}